

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

EStatusCode __thiscall
FreeTypeFaceWrapper::GetGlyphsForUnicodeText
          (FreeTypeFaceWrapper *this,ULongList *inUnicodeCharacters,UIntList *outGlyphs)

{
  IFreeTypeFaceExtender *pIVar1;
  bool bVar2;
  uint uVar3;
  reference puVar4;
  Trace *this_00;
  FT_ULong local_48;
  FT_ULong charCode;
  _Self local_38;
  const_iterator it;
  EStatusCode status;
  FT_UInt glyphIndex;
  UIntList *outGlyphs_local;
  ULongList *inUnicodeCharacters_local;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFace == (FT_Face)0x0) {
    this_local._4_4_ = eFailure;
  }
  else {
    it._M_node._0_4_ = eSuccess;
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear(outGlyphs);
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (inUnicodeCharacters);
    while( true ) {
      charCode = (FT_ULong)
                 std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                           (inUnicodeCharacters);
      bVar2 = std::operator!=(&local_38,(_Self *)&charCode);
      if (!bVar2) break;
      if ((this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) ||
         (uVar3 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[0xb])(),
         (uVar3 & 1) == 0)) {
        puVar4 = std::_List_const_iterator<unsigned_long>::operator*(&local_38);
        local_48 = *puVar4;
        if (((this->mUsePUACodes & 1U) != 0) && (local_48 < 0x100)) {
          local_48 = local_48 | 0xf000;
        }
        it._M_node._4_4_ = FT_Get_Char_Index(this->mFace,local_48);
        if (it._M_node._4_4_ == 0) {
          this_00 = Trace::DefaultTrace();
          puVar4 = std::_List_const_iterator<unsigned_long>::operator*(&local_38);
          Trace::TraceToLog(this_00,
                            "FreeTypeFaceWrapper::GetGlyphsForUnicodeText, failed to find glyph for charachter 0x%04x"
                            ,*puVar4);
          it._M_node._0_4_ = eFailure;
        }
      }
      else {
        pIVar1 = this->mFormatParticularWrapper;
        puVar4 = std::_List_const_iterator<unsigned_long>::operator*(&local_38);
        it._M_node._4_4_ = (*pIVar1->_vptr_IFreeTypeFaceExtender[0xc])(pIVar1,*puVar4);
      }
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (outGlyphs,(value_type_conflict5 *)((long)&it._M_node + 4));
      std::_List_const_iterator<unsigned_long>::operator++(&local_38);
    }
    this_local._4_4_ = (EStatusCode)it._M_node;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode FreeTypeFaceWrapper::GetGlyphsForUnicodeText(const ULongList& inUnicodeCharacters,UIntList& outGlyphs)
{
	if(mFace)
	{
		FT_UInt glyphIndex;
		EStatusCode status = PDFHummus::eSuccess;

		outGlyphs.clear();

		ULongList::const_iterator it = inUnicodeCharacters.begin();
		for(; it != inUnicodeCharacters.end(); ++it)
		{
			if ( mFormatParticularWrapper && mFormatParticularWrapper->HasPrivateEncoding() ) {
					glyphIndex = mFormatParticularWrapper->GetGlyphForUnicodeChar(*it);
				// glyphIndex == 0 is allowed in some Type1 fonts with custom encoding
			}
			else
			{
				FT_ULong charCode = *it;
				if (mUsePUACodes &&  charCode <= 0xff) // move charcode to pua are in case we should use pua and they are in plain ascii range
					charCode = 0xF000 | charCode;
				glyphIndex =  FT_Get_Char_Index(mFace,charCode);
				if(0 == glyphIndex)
				{
					TRACE_LOG1("FreeTypeFaceWrapper::GetGlyphsForUnicodeText, failed to find glyph for charachter 0x%04x",*it);
					status = PDFHummus::eFailure;
				}
			}
			outGlyphs.push_back(glyphIndex);
		}

		return status;
	}
	else
		return PDFHummus::eFailure;
}